

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::UnknownFieldSet::MergeFromCodedStream
          (UnknownFieldSet *this,CodedInputStream *input)

{
  bool bVar1;
  CodedInputStream *in_RSI;
  UnknownFieldSet other;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  UnknownFieldSet *unknown_fields;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  pointer in_stack_ffffffffffffffd8;
  pointer in_stack_ffffffffffffffe0;
  bool local_1;
  
  unknown_fields = (UnknownFieldSet *)&stack0xffffffffffffffd0;
  UnknownFieldSet((UnknownFieldSet *)0x46d697);
  bVar1 = internal::WireFormat::SkipMessage
                    ((CodedInputStream *)
                     CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),unknown_fields);
  if ((bVar1) &&
     (in_stack_ffffffffffffffa7 = io::CodedInputStream::ConsumedEntireMessage(in_RSI),
     (bool)in_stack_ffffffffffffffa7)) {
    MergeFromAndDestroy((UnknownFieldSet *)in_stack_ffffffffffffffe0,
                        (UnknownFieldSet *)in_stack_ffffffffffffffd8);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  ~UnknownFieldSet((UnknownFieldSet *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0))
  ;
  return local_1;
}

Assistant:

bool UnknownFieldSet::MergeFromCodedStream(io::CodedInputStream* input) {
  UnknownFieldSet other;
  if (internal::WireFormat::SkipMessage(input, &other) &&
      input->ConsumedEntireMessage()) {
    MergeFromAndDestroy(&other);
    return true;
  } else {
    return false;
  }
}